

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skynet_server.c
# Opt level: O0

char * cmd_setenv(skynet_context *context,char *param)

{
  long lVar1;
  char *value;
  char *key;
  undefined8 uStack_60;
  char acStack_58 [15];
  bool local_49;
  char *local_48;
  int local_3c;
  long lStack_38;
  int i;
  unsigned_long __vla_expr0;
  size_t local_28;
  size_t sz;
  char *param_local;
  skynet_context *context_local;
  
  uStack_60 = 0x119069;
  sz = (size_t)param;
  param_local = (char *)context;
  local_28 = strlen(param);
  lStack_38 = local_28 + 1;
  lVar1 = -(local_28 + 0x10 & 0xfffffffffffffff0);
  key = acStack_58 + lVar1;
  local_3c = 0;
  while( true ) {
    local_49 = false;
    if (*(char *)(sz + (long)local_3c) != ' ') {
      local_49 = *(char *)(sz + (long)local_3c) != '\0';
    }
    if (local_49 == false) break;
    key[local_3c] = *(char *)(sz + (long)local_3c);
    local_3c = local_3c + 1;
  }
  if (*(char *)(sz + (long)local_3c) != '\0') {
    key[local_3c] = '\0';
    value = (char *)(sz + (long)(local_3c + 1));
    local_48 = key;
    __vla_expr0 = (unsigned_long)acStack_58;
    sz = (size_t)value;
    *(undefined8 *)((long)&uStack_60 + lVar1) = 0x11913e;
    skynet_setenv(key,value);
  }
  return (char *)0x0;
}

Assistant:

static const char *
cmd_setenv(struct skynet_context * context, const char * param) {
	size_t sz = strlen(param);
	char key[sz+1];
	int i;
	for (i=0;param[i] != ' ' && param[i];i++) {
		key[i] = param[i];
	}
	if (param[i] == '\0')
		return NULL;

	key[i] = '\0';
	param += i+1;
	
	skynet_setenv(key,param);
	return NULL;
}